

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::InlinePass::CloneAndMapLocals
          (InlinePass *this,Function *calleeFn,
          vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
          *new_vars,
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *callee2caller,DebugInlinedAtContext *inlined_at_ctx)

{
  IRContext *pIVar1;
  DecorationManager *this_00;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> this_01;
  CommonDebugInfoInstructions CVar2;
  array<signed_char,_4UL> to;
  uint32_t uVar3;
  array<signed_char,_4UL> *paVar4;
  Instruction *this_02;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> var_inst;
  string message;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_90;
  undefined1 local_88 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_68;
  vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
  *local_60;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_58;
  DebugInlinedAtContext *local_50;
  spv_position_t local_48;
  
  this_02 = *(Instruction **)
             ((long)(((calleeFn->blocks_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                    super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                    ._M_t + 0x20);
  local_60 = (vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
              *)new_vars;
  local_58 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)callee2caller;
  local_50 = inlined_at_ctx;
  while( true ) {
    while( true ) {
      if ((this_02->opcode_ != OpVariable) &&
         (CVar2 = Instruction::GetCommonDebugOpcode(this_02), CVar2 != CommonDebugInfoDebugDeclare))
      {
        return true;
      }
      if (this_02->opcode_ == OpVariable) break;
      this_02 = (this_02->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    }
    local_90._M_head_impl = Instruction::Clone(this_02,(this->super_Pass).context_);
    pIVar1 = (this->super_Pass).context_;
    to._M_elems = (_Type)Module::TakeNextIdBound
                                   ((pIVar1->module_)._M_t.
                                    super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                                    .super__Head_base<0UL,_spvtools::opt::Module_*,_false>.
                                    _M_head_impl);
    if ((to._M_elems == (_Type)0x0) &&
       ((pIVar1->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)) {
      local_88._0_8_ = local_88 + 0x10;
      local_48.line._0_4_ = (array<signed_char,_4UL>)0x25;
      local_48.line._4_4_ = (array<signed_char,_4UL>)0x0;
      local_88._0_8_ = std::__cxx11::string::_M_create((ulong *)local_88,(ulong)&local_48);
      local_88._16_8_ = local_48.line;
      *(undefined8 *)local_88._0_8_ = 0x667265766f204449;
      *(undefined8 *)(local_88._0_8_ + 8) = 0x797254202e776f6c;
      *(undefined8 *)(local_88._0_8_ + 0x10) = 0x676e696e6e757220;
      *(undefined8 *)(local_88._0_8_ + 0x18) = 0x746361706d6f6320;
      builtin_strncpy((char *)(local_88._0_8_ + 0x1d),"act-ids.",8);
      local_88._8_8_ = local_48.line;
      *(char *)(local_88._0_8_ + local_48.line) = '\0';
      local_48.line = 0;
      local_48.column = 0;
      local_48.index = 0;
      std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
      ::operator()(&pIVar1->consumer_,SPV_MSG_ERROR,"",&local_48,(char *)local_88._0_8_);
      if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
        operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
      }
    }
    if (to._M_elems == (_Type)0x0) break;
    pIVar1 = (this->super_Pass).context_;
    if ((pIVar1->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
      IRContext::BuildDecorationManager(pIVar1);
    }
    this_00 = (pIVar1->decoration_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
              _M_head_impl;
    uVar3 = 0;
    if (this_02->has_result_id_ == true) {
      uVar3 = Instruction::GetSingleWordOperand(this_02,(uint)this_02->has_type_id_);
    }
    analysis::DecorationManager::CloneDecorations(this_00,uVar3,(uint32_t)to._M_elems);
    if ((local_90._M_head_impl)->has_result_id_ == false) {
      __assert_fail("has_result_id_",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                    ,0x2c8,"void spvtools::opt::Instruction::SetResultId(uint32_t)");
    }
    local_88._0_8_ = &PTR__SmallVector_00b15d78;
    local_88._24_8_ = local_88 + 0x10;
    local_68._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_88[0x10] = to._M_elems[0];
    local_88[0x11] = to._M_elems[1];
    local_88[0x12] = to._M_elems[2];
    local_88[0x13] = to._M_elems[3];
    local_88._8_4_ = (array<signed_char,_4UL>)0x1;
    local_88._12_4_ = (array<signed_char,_4UL>)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)
               ((long)&((OperandData *)
                       (((((local_90._M_head_impl)->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_start)->words).buffer + -4))->
                       _vptr_SmallVector +
               (ulong)((uint)(local_90._M_head_impl)->has_type_id_ * 0x30)),
               (SmallVector<unsigned_int,_2UL> *)local_88);
    local_88._0_8_ = &PTR__SmallVector_00b15d78;
    if (local_68._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_68,local_68._M_head_impl);
    }
    this_01._M_head_impl = local_90._M_head_impl;
    pIVar1 = (this->super_Pass).context_;
    if ((pIVar1->valid_analyses_ & kAnalysisDebugInfo) == kAnalysisNone) {
      IRContext::BuildDebugInfoManager(pIVar1);
    }
    uVar3 = analysis::DebugInfoManager::BuildDebugInlinedAtChain
                      ((pIVar1->debug_info_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>.
                       _M_head_impl,(this_02->dbg_scope_).inlined_at_,local_50);
    Instruction::UpdateDebugInlinedAt(this_01._M_head_impl,uVar3);
    uVar3 = 0;
    if (this_02->has_result_id_ == true) {
      uVar3 = Instruction::GetSingleWordOperand(this_02,(uint)this_02->has_type_id_);
    }
    local_88._0_4_ = uVar3;
    paVar4 = (array<signed_char,_4UL> *)
             std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[](local_58,(key_type *)local_88);
    *&paVar4->_M_elems = to._M_elems;
    std::
    vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
    ::
    emplace_back<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
              (local_60,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                         *)&local_90);
    this_02 = (this_02->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    if (local_90._M_head_impl != (Instruction *)0x0) {
      (*((local_90._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        _vptr_IntrusiveNodeBase[1])();
    }
  }
  if (local_90._M_head_impl != (Instruction *)0x0) {
    (*((local_90._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
      _vptr_IntrusiveNodeBase[1])();
  }
  return false;
}

Assistant:

bool InlinePass::CloneAndMapLocals(
    Function* calleeFn, std::vector<std::unique_ptr<Instruction>>* new_vars,
    std::unordered_map<uint32_t, uint32_t>* callee2caller,
    analysis::DebugInlinedAtContext* inlined_at_ctx) {
  auto callee_block_itr = calleeFn->begin();
  auto callee_var_itr = callee_block_itr->begin();
  while (callee_var_itr->opcode() == spv::Op::OpVariable ||
         callee_var_itr->GetCommonDebugOpcode() ==
             CommonDebugInfoDebugDeclare) {
    if (callee_var_itr->opcode() != spv::Op::OpVariable) {
      ++callee_var_itr;
      continue;
    }

    std::unique_ptr<Instruction> var_inst(callee_var_itr->Clone(context()));
    uint32_t newId = context()->TakeNextId();
    if (newId == 0) {
      return false;
    }
    get_decoration_mgr()->CloneDecorations(callee_var_itr->result_id(), newId);
    var_inst->SetResultId(newId);
    var_inst->UpdateDebugInlinedAt(
        context()->get_debug_info_mgr()->BuildDebugInlinedAtChain(
            callee_var_itr->GetDebugInlinedAt(), inlined_at_ctx));
    (*callee2caller)[callee_var_itr->result_id()] = newId;
    new_vars->push_back(std::move(var_inst));
    ++callee_var_itr;
  }
  return true;
}